

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper.cpp
# Opt level: O0

void __thiscall
cppcms::url_mapper::real_assign(url_mapper *this,string *key,string *url,application *child)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __end;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __end_00;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __end_01;
  bool bVar1;
  bool bVar2;
  reference pcVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  int *piVar8;
  undefined8 uVar9;
  data *pdVar10;
  pointer ppVar11;
  mapped_type *this_00;
  long in_RCX;
  hold_ptr<cppcms::url_mapper::data> *in_RDI;
  const_iterator p2;
  iterator p_1;
  int index;
  uint i;
  bool all_digits;
  string hkey;
  int max_index;
  const_iterator p;
  const_iterator prev;
  entry e;
  entry *in_stack_fffffffffffffb18;
  entry *in_stack_fffffffffffffb20;
  value_type *in_stack_fffffffffffffb28;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffb30;
  allocator<char> *in_stack_fffffffffffffb38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb40;
  undefined7 in_stack_fffffffffffffb48;
  undefined1 in_stack_fffffffffffffb4f;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffb50;
  data *in_stack_fffffffffffffb58;
  iterator in_stack_fffffffffffffb60;
  char *in_stack_fffffffffffffb68;
  by_key_type *__lhs;
  iterator local_338;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>
  local_330;
  undefined8 local_328;
  iterator local_320;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>
  local_318;
  _Self local_310 [7];
  _Self local_2d8;
  undefined1 local_2c9;
  _Self local_288 [7];
  _Self local_250;
  allocator<char> local_241;
  char *local_240;
  char *local_238;
  string local_230 [38];
  undefined1 local_20a;
  allocator local_209;
  string local_208 [32];
  char *local_1e8;
  undefined1 local_1da;
  allocator local_1d9;
  string local_1d8 [32];
  char *local_1b8;
  undefined1 local_1aa;
  allocator local_1a9;
  string local_1a8 [32];
  undefined8 local_188;
  char *local_180;
  undefined1 local_172;
  allocator local_171;
  string local_170 [32];
  int local_150 [3];
  byte local_143;
  undefined1 local_142;
  allocator local_141;
  string local_140 [32];
  char *local_120;
  allocator<char> local_111;
  char *local_110;
  char *local_108;
  string local_100 [32];
  undefined8 local_e0;
  allocator<char> local_c1;
  char *local_c0;
  char *local_b8;
  string local_b0 [32];
  undefined8 local_90;
  int local_84;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  char *local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  long local_28;
  long local_20;
  
  local_20 = in_RCX;
  data::entry::entry(in_stack_fffffffffffffb20);
  local_78 = (char *)std::__cxx11::string::begin();
  local_80._M_current = (char *)std::__cxx11::string::begin();
  local_84 = 0;
  do {
    while( true ) {
      local_90 = std::__cxx11::string::end();
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffffb20,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffffb18);
      if (!bVar1) {
        if ((local_20 != 0) && (local_84 != 1)) {
          local_20a = 1;
          uVar9 = __cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_208,
                     "cppcms::url_mapper the application mapping should use only 1 parameter",
                     &local_209);
          cppcms_error::cppcms_error
                    ((cppcms_error *)in_stack_fffffffffffffb20,(string *)in_stack_fffffffffffffb18);
          local_20a = 0;
          __cxa_throw(uVar9,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
        }
        local_238 = local_78;
        local_240 = local_80._M_current;
        std::allocator<char>::allocator();
        __end_01._M_current._7_1_ = in_stack_fffffffffffffb4f;
        __end_01._M_current._0_7_ = in_stack_fffffffffffffb48;
        std::__cxx11::string::
        string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                  (in_stack_fffffffffffffb40,in_stack_fffffffffffffb50,__end_01,
                   in_stack_fffffffffffffb38);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&in_stack_fffffffffffffb20->parts,(value_type *)in_stack_fffffffffffffb18);
        std::__cxx11::string::~string(local_230);
        std::allocator<char>::~allocator(&local_241);
        local_28 = local_20;
        if (local_20 == 0) {
          pdVar10 = booster::hold_ptr<cppcms::url_mapper::data>::operator->(in_RDI);
          __lhs = &pdVar10->by_key;
          string_key::string_key
                    ((string_key *)in_stack_fffffffffffffb20,(string *)in_stack_fffffffffffffb18);
          in_stack_fffffffffffffb60 =
               std::
               map<cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>_>_>
               ::find((map<cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>_>_>
                       *)in_stack_fffffffffffffb18,(key_type *)0x3bb279);
          local_2d8._M_node = in_stack_fffffffffffffb60._M_node;
          string_key::~string_key((string_key *)0x3bb29a);
          in_stack_fffffffffffffb58 =
               booster::hold_ptr<cppcms::url_mapper::data>::operator->(in_RDI);
          local_310[0]._M_node =
               (_Base_ptr)
               std::
               map<cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>_>_>
               ::end((map<cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>_>_>
                      *)in_stack_fffffffffffffb18);
          bVar1 = std::operator!=(&local_2d8,local_310);
          if (bVar1) {
            std::
            _Rb_tree_iterator<std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>_>
            ::operator->((_Rb_tree_iterator<std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>_>
                          *)in_stack_fffffffffffffb20);
            local_328 = 1;
            local_320._M_node =
                 (_Base_ptr)
                 std::
                 map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>
                 ::find((map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>
                         *)in_stack_fffffffffffffb18,(key_type *)0x3bb30f);
            std::
            _Rb_tree_const_iterator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>
            ::_Rb_tree_const_iterator(&local_318,&local_320);
            std::
            _Rb_tree_iterator<std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>_>
            ::operator->((_Rb_tree_iterator<std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>_>
                          *)in_stack_fffffffffffffb20);
            local_338._M_node =
                 (_Base_ptr)
                 std::
                 map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>
                 ::end((map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>
                        *)in_stack_fffffffffffffb18);
            std::
            _Rb_tree_const_iterator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>
            ::_Rb_tree_const_iterator(&local_330,&local_338);
            bVar2 = std::operator!=(&local_318,&local_330);
            bVar1 = false;
            if (bVar2) {
              ppVar11 = std::
                        _Rb_tree_const_iterator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>
                        ::operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>
                                      *)0x3bb39f);
              bVar1 = (ppVar11->second).child != (application *)0x0;
            }
            if (bVar1) {
              uVar9 = __cxa_allocate_exception(0x30);
              std::operator+((char *)__lhs,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffb60._M_node);
              std::operator+(in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20);
              cppcms_error::cppcms_error
                        ((cppcms_error *)in_stack_fffffffffffffb20,
                         (string *)in_stack_fffffffffffffb18);
              __cxa_throw(uVar9,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
            }
          }
        }
        else {
          booster::hold_ptr<cppcms::url_mapper::data>::operator->(in_RDI);
          string_key::string_key
                    ((string_key *)in_stack_fffffffffffffb20,(string *)in_stack_fffffffffffffb18);
          local_250._M_node =
               (_Base_ptr)
               std::
               map<cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>_>_>
               ::find((map<cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>_>_>
                       *)in_stack_fffffffffffffb18,(key_type *)0x3bb02f);
          booster::hold_ptr<cppcms::url_mapper::data>::operator->(in_RDI);
          local_288[0]._M_node =
               (_Base_ptr)
               std::
               map<cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>_>_>
               ::end((map<cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>_>_>
                      *)in_stack_fffffffffffffb18);
          bVar1 = std::operator!=(&local_250,local_288);
          string_key::~string_key((string_key *)0x3bb093);
          if (bVar1) {
            local_2c9 = 1;
            uVar9 = __cxa_allocate_exception(0x30);
            std::operator+(in_stack_fffffffffffffb68,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffb60._M_node);
            std::operator+(in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20);
            cppcms_error::cppcms_error
                      ((cppcms_error *)in_stack_fffffffffffffb20,(string *)in_stack_fffffffffffffb18
                      );
            local_2c9 = 0;
            __cxa_throw(uVar9,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
          }
        }
        booster::hold_ptr<cppcms::url_mapper::data>::operator->(in_RDI);
        string_key::string_key
                  ((string_key *)in_stack_fffffffffffffb20,(string *)in_stack_fffffffffffffb18);
        std::
        map<cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>_>_>
        ::operator[]((map<cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>_>_>
                      *)in_stack_fffffffffffffb60._M_node,(key_type *)in_stack_fffffffffffffb58);
        this_00 = std::
                  map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>
                  ::operator[]((map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>
                                *)in_stack_fffffffffffffb60._M_node,
                               (key_type *)in_stack_fffffffffffffb58);
        data::entry::operator=(this_00,in_stack_fffffffffffffb18);
        string_key::~string_key((string_key *)0x3bb57f);
        data::entry::~entry(this_00);
        return;
      }
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_80);
      if (*pcVar3 == '{') break;
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_80);
      if (*pcVar3 == '}') {
        local_1da = 1;
        uVar9 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_1d8,"cppcms::url_mapper: \'}\' in url without \'{\'",&local_1d9);
        cppcms_error::cppcms_error
                  ((cppcms_error *)in_stack_fffffffffffffb20,(string *)in_stack_fffffffffffffb18);
        local_1da = 0;
        __cxa_throw(uVar9,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
      }
      local_1e8 = (char *)__gnu_cxx::
                          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)in_stack_fffffffffffffb28,
                                       (int)((ulong)in_stack_fffffffffffffb20 >> 0x20));
    }
    local_b8 = local_78;
    local_c0 = local_80._M_current;
    std::allocator<char>::allocator();
    __end._M_current._7_1_ = in_stack_fffffffffffffb4f;
    __end._M_current._0_7_ = in_stack_fffffffffffffb48;
    std::__cxx11::string::
    string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
              (in_stack_fffffffffffffb40,in_stack_fffffffffffffb50,__end,in_stack_fffffffffffffb38);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&in_stack_fffffffffffffb20->parts,(value_type *)in_stack_fffffffffffffb18);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator(&local_c1);
    local_78 = local_80._M_current;
    while( true ) {
      local_e0 = std::__cxx11::string::end();
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffffb20,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffffb18);
      if (!bVar1) goto LAB_003babaf;
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_80);
      if (*pcVar3 == '}') break;
      local_180 = (char *)__gnu_cxx::
                          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)in_stack_fffffffffffffb28,
                                       (int)((ulong)in_stack_fffffffffffffb20 >> 0x20));
    }
    local_108 = (char *)__gnu_cxx::
                        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator+((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)in_stack_fffffffffffffb28,
                                    (difference_type)in_stack_fffffffffffffb20);
    local_110 = local_80._M_current;
    std::allocator<char>::allocator();
    __end_00._M_current._7_1_ = in_stack_fffffffffffffb4f;
    __end_00._M_current._0_7_ = in_stack_fffffffffffffb48;
    std::__cxx11::string::
    string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
              (in_stack_fffffffffffffb40,in_stack_fffffffffffffb50,__end_00,
               in_stack_fffffffffffffb38);
    std::allocator<char>::~allocator(&local_111);
    local_120 = (char *)__gnu_cxx::
                        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator+((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)in_stack_fffffffffffffb28,
                                    (difference_type)in_stack_fffffffffffffb20);
    local_78 = local_120;
    lVar4 = std::__cxx11::string::size();
    if (lVar4 == 0) {
      local_142 = 1;
      uVar9 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_140,"cppcms::url_mapper: empty index between {}",&local_141);
      cppcms_error::cppcms_error
                ((cppcms_error *)in_stack_fffffffffffffb20,(string *)in_stack_fffffffffffffb18);
      local_142 = 0;
      __cxa_throw(uVar9,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
    }
    local_143 = 1;
    local_150[2] = 0;
    while( true ) {
      bVar1 = false;
      if ((local_143 & 1) != 0) {
        uVar5 = (ulong)(uint)local_150[2];
        uVar6 = std::__cxx11::string::size();
        bVar1 = uVar5 < uVar6;
      }
      if (!bVar1) break;
      pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_100);
      if ((*pcVar7 < '0') ||
         (pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_100), '9' < *pcVar7)) {
        local_143 = 0;
      }
      local_150[2] = local_150[2] + 1;
    }
    if ((local_143 & 1) == 0) {
      local_150[1] = 0;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb20,
                 (value_type_conflict1 *)in_stack_fffffffffffffb18);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
    }
    else {
      pcVar7 = (char *)std::__cxx11::string::c_str();
      local_150[0] = atoi(pcVar7);
      if (local_150[0] == 0) {
        local_172 = 1;
        uVar9 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_170,"cppcms::url_mapper: index 0 is invalid",&local_171);
        cppcms_error::cppcms_error
                  ((cppcms_error *)in_stack_fffffffffffffb20,(string *)in_stack_fffffffffffffb18);
        local_172 = 0;
        __cxa_throw(uVar9,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
      }
      piVar8 = std::max<int>(local_150,&local_84);
      local_84 = *piVar8;
      std::vector<int,_std::allocator<int>_>::push_back
                (in_stack_fffffffffffffb30,(value_type_conflict1 *)in_stack_fffffffffffffb28);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::size(&local_40);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffb40,(size_type)in_stack_fffffffffffffb38);
    }
    std::__cxx11::string::~string(local_100);
LAB_003babaf:
    local_188 = std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator==
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffffb20,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffffb18);
    if (bVar1) {
      local_1aa = 1;
      uVar9 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1a8,"cppcms::url_mapper: \'{\' in url without \'}\'",&local_1a9);
      cppcms_error::cppcms_error
                ((cppcms_error *)in_stack_fffffffffffffb20,(string *)in_stack_fffffffffffffb18);
      local_1aa = 0;
      __cxa_throw(uVar9,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
    }
    local_1b8 = (char *)__gnu_cxx::
                        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)in_stack_fffffffffffffb28,
                                     (int)((ulong)in_stack_fffffffffffffb20 >> 0x20));
  } while( true );
}

Assistant:

void url_mapper::real_assign(std::string const &key,std::string const &url,application *child)
	{

		data::entry e;
		std::string::const_iterator prev = url.begin(), p = url.begin();

		int max_index = 0;

		while(p!=url.end()) {
			if(*p=='{') {
				e.parts.push_back(std::string(prev,p));
				prev = p;
				while(p!=url.end()) {
					if(*p=='}') {
						std::string const hkey(prev+1,p);
						prev = p+1;
						if(hkey.size()==0) {
							throw cppcms_error("cppcms::url_mapper: empty index between {}");
						}
						bool all_digits = true;
						for(unsigned i=0;all_digits && i<hkey.size();i++) {
							if(hkey[i] < '0' || '9' <hkey[i])
								all_digits = false;
						}
						if(!all_digits) {
							e.indexes.push_back(0);
							e.keys.push_back(hkey);
						}
						else {
							int index = atoi(hkey.c_str());
							if(index == 0)
								throw cppcms_error("cppcms::url_mapper: index 0 is invalid");
							max_index = std::max(index,max_index);
							e.indexes.push_back(index);
							e.keys.resize(e.keys.size()+1);
						}
						break;
					}
					else
						p++;
				}
				if(p==url.end())
					throw cppcms_error("cppcms::url_mapper: '{' in url without '}'");
				p++;
			}
			else if(*p=='}') {
				throw cppcms_error("cppcms::url_mapper: '}' in url without '{'");
			}
			else
				p++;
		}
		if(child && max_index!=1) {
			throw cppcms_error("cppcms::url_mapper the application mapping should use only 1 parameter");
		}
		e.parts.push_back(std::string(prev,p));

		e.child = child;

		if(child) {
			if(d->by_key.find(key)!=d->by_key.end()) 
				throw cppcms_error(	"cppcms::url_mapper: mounted application key `" + key +
							"' can't be shared with ordinary url key");
		}
		else {
			data::by_key_type::iterator p = d->by_key.find(key);
			if(p!=d->by_key.end()) {
				data::by_size_type::const_iterator p2 = p->second.find(1);
				if(p2!=p->second.end() && p2->second.child) 
				{
					throw cppcms_error(	"cppcms::url_mapper: ordinary url key `"+key+
								"can't be shared with mounted application key");
				}
			}
		}
		d->by_key[key][max_index] = e;
	}